

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O2

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx,MppMeta meta)

{
  Vepu541RoiCfg *cfg;
  ushort uVar1;
  void *__s;
  void *__s_00;
  ulong uVar2;
  Vepu580RoiH265BsCfg val;
  int iVar3;
  long lVar4;
  Vepu541RoiCfg *src;
  uint uVar5;
  uint uVar6;
  undefined2 *puVar7;
  ulong uVar8;
  RK_S32 i;
  ulong uVar9;
  int iVar10;
  RK_U32 RVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  ushort uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  RK_S32 cu16cnt;
  ulong uVar23;
  RK_U32 *buf;
  bool bVar24;
  void *local_98;
  
  iVar3 = *(int *)((long)ctx + 0x20);
  if (iVar3 == 0x10) {
    lVar4 = *(long *)((long)ctx + 0x38);
    uVar6 = *(uint *)((long)ctx + 0x1c);
    lVar12 = 0;
    uVar14 = 0;
    if (0 < (int)uVar6) {
      uVar14 = (ulong)uVar6;
    }
    puVar7 = (undefined2 *)(*(long *)((long)ctx + 0x10) + 0x10);
    for (; uVar14 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      *(undefined8 *)(lVar4 + lVar12) = *(undefined8 *)(puVar7 + -8);
      *(undefined2 *)(lVar4 + 8 + lVar12) = puVar7[-4];
      *(undefined1 *)(lVar4 + 0xf + lVar12) = *(undefined1 *)(puVar7 + -2);
      *(undefined2 *)(lVar4 + 10 + lVar12) = *puVar7;
      *(undefined1 *)(lVar4 + 0xe + lVar12) = 1;
      *(undefined2 *)(lVar4 + 0xc + lVar12) = 0;
      puVar7 = puVar7 + 10;
    }
    *(uint *)((long)ctx + 0x28) = uVar6;
    *(long *)((long)ctx + 0x30) = lVar4;
    mpp_meta_set_ptr(meta,0x726f6920,(long)ctx + 0x28);
  }
  else {
    if (iVar3 == 2) {
      gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        lVar4 = *(long *)((long)ctx + 0xb8);
        buf = *(RK_U32 **)((long)ctx + 0x78);
        local_98 = *(void **)((long)ctx + 0x80);
        if (buf != (RK_U32 *)0x0 && (local_98 != (void *)0x0 && lVar4 != 0)) {
          uVar19 = *(int *)((long)ctx + 4) + 0x3f >> 6;
          uVar6 = *ctx + 0x3f >> 6;
          memset(local_98,0,(long)(int)(uVar6 * uVar19 * 0x100));
          memset(buf,0,(long)(int)(uVar6 * uVar19 * 0x40));
          uVar14 = 0;
          uVar16 = 0;
          if (0 < (int)uVar6) {
            uVar16 = (ulong)uVar6;
          }
          uVar8 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar8 = uVar14;
          }
          for (; uVar14 != uVar8; uVar14 = uVar14 + 1) {
            for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
              if (*(char *)(uVar14 * (long)(int)uVar6 + *(long *)((long)ctx + 0xa8) + uVar9) != '\0'
                 ) {
                iVar3 = 0;
                for (uVar23 = 0; uVar23 != 0x10; uVar23 = uVar23 + 1) {
                  cfg = (Vepu541RoiCfg *)
                        (lVar4 + (long)(int)((((uint)(uVar23 >> 2) & 0x3fffffff) + (int)uVar14 * 4)
                                             * uVar6 * 4 + ((uint)uVar23 & 3 | (int)uVar9 * 4)) * 2)
                  ;
                  RVar11 = raster2zscan16[uVar23];
                  bVar22 = SUB21(*cfg,0) * '\b' & 8;
                  bVar24 = ((ushort)*cfg & 0x7f00) != 0;
                  val = (Vepu580RoiH265BsCfg)(bVar24 * '\x02' | bVar22);
                  bVar22 = bVar22 >> 3;
                  iVar3 = iVar3 + (uint)(bVar24 | bVar22);
                  set_roi_cu16_split_cu8(buf,(uint)uVar23,val);
                  uVar5 = (uint)bVar24;
                  buf[RVar11 + 0x1e9 >> 5] =
                       buf[RVar11 + 0x1e9 >> 5] | uVar5 << ((byte)(RVar11 + 0x1e9) & 0x1f);
                  uVar19 = RVar11 * 2 + 0x12a;
                  buf[uVar19 >> 5] = buf[uVar19 >> 5] | (uint)bVar22 << ((byte)uVar19 & 0x1f);
                  set_roi_qp_cfg(local_98,RVar11 + 0x40,cfg);
                  if ((uVar23 == 0xf) && (iVar3 == 0x10)) {
                    buf[0xf] = buf[0xf] | uVar5 << 0x1d;
                    buf[10] = buf[10] | (uint)bVar22 << 0x12;
                    set_roi_qp_cfg(local_98,0x54,cfg);
                    uVar19 = 0;
                    for (iVar10 = 10; iVar10 != 0x12; iVar10 = iVar10 + 2) {
                      buf[0xf] = buf[0xf] | uVar5 << ((char)uVar19 + 0x19U & 0x1f);
                      buf[10] = buf[10] | (uint)bVar22 << ((byte)iVar10 & 0x1f);
                      set_roi_qp_cfg(local_98,uVar19 | 0x50,cfg);
                      uVar19 = uVar19 + 1;
                    }
                    for (RVar11 = 0; RVar11 != 0x40; RVar11 = RVar11 + 1) {
                      set_roi_cu8_base_cfg(buf,RVar11,val);
                      set_roi_qp_cfg(local_98,RVar11,cfg);
                    }
                  }
                  else if ((uVar23 == 0xf) && (iVar3 != 0)) {
                    uVar19 = buf[0xd] | 0x100;
                    for (iVar10 = 0; iVar10 != 4; iVar10 = iVar10 + 1) {
                      uVar19 = uVar19 | 0x10 << ((byte)iVar10 & 0x1f);
                    }
                    buf[0xd] = uVar19;
                    for (uVar19 = 0x194; uVar19 != 0x1a4; uVar19 = uVar19 + 1) {
                      buf[uVar19 >> 5] = buf[uVar19 >> 5] | 1 << ((byte)uVar19 & 0x1f);
                    }
                  }
                }
              }
              buf = buf + 0x10;
              local_98 = (void *)((long)local_98 + 0xc0);
            }
          }
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        lVar4 = *(long *)((long)ctx + 0xb8);
        __s = *(void **)((long)ctx + 0x78);
        __s_00 = *(void **)((long)ctx + 0x80);
        if (__s != (void *)0x0 && (__s_00 != (void *)0x0 && lVar4 != 0)) {
          uVar6 = (*ctx + 0xf >> 4) + 3U & 0xfffffffc;
          uVar19 = *(int *)((long)ctx + 4) + 0xf >> 4;
          iVar3 = (uVar19 + 3 & 0x3ffffffc) * uVar6;
          uVar16 = 0;
          memset(__s,0,(long)(iVar3 * 8));
          memset(__s_00,0,(long)(iVar3 * 2));
          uVar14 = 0;
          if (0 < (int)uVar6) {
            uVar14 = (ulong)uVar6;
          }
          uVar8 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar8 = uVar16;
          }
          for (uVar9 = 0; uVar23 = uVar14, uVar15 = uVar16, uVar9 != uVar8; uVar9 = uVar9 + 1) {
            while (uVar23 != 0) {
              if (*(char *)(*(long *)((long)ctx + 0xa8) + uVar15) != '\0') {
                uVar17 = *(ushort *)(lVar4 + uVar15 * 2) & 0x7f00;
                uVar1 = *(ushort *)((long)__s_00 + uVar15 * 2);
                *(ushort *)((long)__s_00 + uVar15 * 2) = uVar1 & 0x80ff | uVar17;
                uVar18 = *(ushort *)(lVar4 + uVar15 * 2) & 0x8000;
                *(ushort *)((long)__s_00 + uVar15 * 2) = uVar1 & 0xff | uVar17 | uVar18;
                *(ushort *)((long)__s_00 + uVar15 * 2) =
                     uVar1 & 0xf | uVar17 | uVar18 | *(ushort *)(lVar4 + uVar15 * 2) & 0x70;
                uVar20 = (ulong)(*(ushort *)(lVar4 + uVar15 * 2) & 1) << 0x3d;
                uVar2 = *(ulong *)((long)__s + uVar15 * 8);
                *(ulong *)((long)__s + uVar15 * 8) = uVar2 & 0xdfffffffffffffff | uVar20;
                *(ulong *)((long)__s + uVar15 * 8) =
                     uVar2 & 0x9fffffffffffffff | uVar20 |
                     (ulong)((*(ushort *)(lVar4 + uVar15 * 2) & 0x7f00) != 0) << 0x3e;
              }
              uVar23 = uVar23 - 1;
              uVar15 = uVar15 + 1;
            }
            uVar16 = uVar16 + (long)(int)uVar6;
          }
        }
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      mpp_buffer_sync_end_f(*(undefined8 *)((long)ctx + 0x48),1,"mpp_enc_roi_setup_meta");
      uVar13 = *(undefined8 *)((long)ctx + 0x50);
    }
    else {
      if (iVar3 != 1) goto LAB_00109f4c;
      if (*(int *)((long)ctx + 8) == 0x1000004) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0xb8));
        lVar4 = *(long *)((long)ctx + 0x78);
        lVar12 = *(long *)((long)ctx + 0xb8);
        uVar19 = *ctx + 0x3f >> 6;
        uVar6 = *(int *)((long)ctx + 4) + 0x3f >> 6;
        uVar14 = 0;
        uVar16 = 0;
        if (0 < (int)uVar19) {
          uVar16 = (ulong)uVar19;
        }
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = uVar14;
        }
        for (; uVar14 != uVar8; uVar14 = uVar14 + 1) {
          lVar21 = lVar4;
          for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
            for (uVar23 = 0; uVar23 != 0x10; uVar23 = uVar23 + 1) {
              *(undefined2 *)(lVar21 + uVar23 * 2) =
                   *(undefined2 *)
                    (lVar12 + (long)(int)((((uint)(uVar23 >> 2) & 0x3fffffff) + (int)uVar14 * 4) *
                                          uVar19 * 4 + ((uint)uVar23 & 3 | (int)uVar9 * 4)) * 2);
            }
            lVar21 = lVar21 + 0x20;
          }
          lVar4 = lVar4 + (long)(int)uVar19 * 0x20;
        }
      }
      else if (*(int *)((long)ctx + 8) == 7) {
        gen_vepu54x_roi((MppEncRoiImpl *)ctx,*(Vepu541RoiCfg **)((long)ctx + 0x78));
      }
      mpp_meta_set_ptr(meta,0x726f6932,(long)ctx + 0x48);
      uVar13 = *(undefined8 *)((long)ctx + 0x48);
    }
    mpp_buffer_sync_end_f(uVar13,1,"mpp_enc_roi_setup_meta");
  }
LAB_00109f4c:
  *(undefined4 *)((long)ctx + 0x1c) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_roi_setup_meta(MppEncRoiCtx ctx, MppMeta meta)
{
    MppEncRoiImpl *impl = (MppEncRoiImpl *)ctx;

    switch (impl->roi_type) {
    case ROI_TYPE_1 : {
        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu54x_roi(impl, impl->dst_base);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu54x_roi(impl, impl->tmp);
            vepu54x_h265_set_roi(impl->dst_base, impl->tmp, impl->w, impl->h);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
    } break;
    case ROI_TYPE_2 : {
        gen_vepu54x_roi(impl, impl->tmp);

        switch (impl->type) {
        case MPP_VIDEO_CodingAVC : {
            gen_vepu580_roi_h264(impl);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            gen_vepu580_roi_h265(impl);
        } break;
        default : {
        } break;
        }

        mpp_meta_set_ptr(meta, KEY_ROI_DATA2, (void*)&impl->roi_cfg);
        mpp_buffer_sync_ro_end(impl->roi_cfg.base_cfg_buf);
        mpp_buffer_sync_ro_end(impl->roi_cfg.qp_cfg_buf);
    } break;
    case ROI_TYPE_LEGACY : {
        MppEncROIRegion *region = impl->legacy_roi_region;
        MppEncROICfg *roi_cfg = &impl->legacy_roi_cfg;
        RoiRegionCfg *regions = impl->regions;
        RK_S32 i;

        for (i = 0; i < impl->count; i++) {
            region[i].x = regions[i].x;
            region[i].y = regions[i].y;
            region[i].w = regions[i].w;
            region[i].h = regions[i].h;

            region[i].intra = regions[i].force_intra;
            region[i].abs_qp_en = regions[i].qp_mode;
            region[i].quality = regions[i].qp_val;
            region[i].area_map_en = 1;
            region[i].qp_area_idx = 0;
        }

        roi_cfg->number = impl->count;
        roi_cfg->regions = region;

        mpp_meta_set_ptr(meta, KEY_ROI_DATA, (void*)roi_cfg);
    } break;
    default : {
    } break;
    }

    impl->count = 0;

    return MPP_OK;
}